

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Checkpoint(sqlite3 *db,int iDb,int eMode,int *pnLog,int *pnCkpt)

{
  int *piVar1;
  Btree *p;
  BtShared *pBVar2;
  Pager *pPVar3;
  sqlite3 *db_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  _func_int_void_ptr *xBusy;
  int iVar7;
  long lVar8;
  long lVar9;
  int *local_40;
  
  if (db->nDb < 1) {
    iVar6 = 0;
  }
  else {
    lVar8 = 0;
    bVar5 = false;
    lVar9 = 1;
    local_40 = pnLog;
    do {
      if (iDb == 0xc || (ulong)(uint)iDb << 5 == lVar8) {
        p = *(Btree **)((long)&db->aDb->pBt + lVar8);
        if (p == (Btree *)0x0) {
          iVar6 = 0;
        }
        else {
          pBVar2 = p->pBt;
          if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
            btreeLockCarefully(p);
          }
          iVar6 = 6;
          if (pBVar2->inTransaction == '\0') {
            pPVar3 = pBVar2->pPager;
            db_00 = p->db;
            if ((pPVar3->pWal == (Wal *)0x0) && (pPVar3->journalMode == '\x05')) {
              sqlite3_exec(db_00,"PRAGMA table_list",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0)
              ;
            }
            if (pPVar3->pWal == (Wal *)0x0) {
              iVar6 = 0;
            }
            else {
              if (eMode == 0) {
                xBusy = (_func_int_void_ptr *)0x0;
              }
              else {
                xBusy = pPVar3->xBusyHandler;
              }
              iVar6 = sqlite3WalCheckpoint
                                (pPVar3->pWal,db_00,eMode,xBusy,pPVar3->pBusyHandlerArg,
                                 (uint)pPVar3->walSyncFlags,(int)pPVar3->pageSize,
                                 (u8 *)pPVar3->pTmpSpace,local_40,pnCkpt);
            }
          }
          if (p->sharable != '\0') {
            piVar1 = &p->wantToLock;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              unlockBtreeMutex(p);
            }
          }
        }
        iVar7 = iVar6;
        if (iVar6 == 5) {
          iVar7 = 0;
        }
        if (iVar6 == 5) {
          bVar5 = true;
        }
        local_40 = (int *)0x0;
        pnCkpt = (int *)0x0;
      }
      else {
        iVar7 = 0;
      }
      if (iVar7 != 0) break;
      lVar8 = lVar8 + 0x20;
      bVar4 = lVar9 < db->nDb;
      lVar9 = lVar9 + 1;
    } while (bVar4);
    iVar6 = 5;
    if (!bVar5) {
      iVar6 = iVar7;
    }
    if (iVar7 != 0) {
      iVar6 = iVar7;
    }
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3Checkpoint(sqlite3 *db, int iDb, int eMode, int *pnLog, int *pnCkpt){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* Used to iterate through attached dbs */
  int bBusy = 0;                  /* True if SQLITE_BUSY has been encountered */

  assert( sqlite3_mutex_held(db->mutex) );
  assert( !pnLog || *pnLog==-1 );
  assert( !pnCkpt || *pnCkpt==-1 );
  testcase( iDb==SQLITE_MAX_ATTACHED ); /* See forum post a006d86f72 */
  testcase( iDb==SQLITE_MAX_DB );

  for(i=0; i<db->nDb && rc==SQLITE_OK; i++){
    if( i==iDb || iDb==SQLITE_MAX_DB ){
      rc = sqlite3BtreeCheckpoint(db->aDb[i].pBt, eMode, pnLog, pnCkpt);
      pnLog = 0;
      pnCkpt = 0;
      if( rc==SQLITE_BUSY ){
        bBusy = 1;
        rc = SQLITE_OK;
      }
    }
  }

  return (rc==SQLITE_OK && bBusy) ? SQLITE_BUSY : rc;
}